

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_grasshopper_cipher.c
# Opt level: O3

int gost_grasshopper_set_asn1_parameters(EVP_CIPHER_CTX *ctx,ASN1_TYPE *params)

{
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  uchar *iv;
  
  uVar2 = EVP_CIPHER_CTX_get0_cipher();
  iVar1 = EVP_CIPHER_get_mode(uVar2);
  if (iVar1 == 5) {
    lVar3 = EVP_CIPHER_CTX_get_cipher_data(ctx);
    *(undefined4 *)(lVar3 + 0x1a8) = 0x40000;
    iv = (uchar *)EVP_CIPHER_CTX_original_iv(ctx);
    iVar1 = gost2015_set_asn1_params(params,iv,8,(uchar *)(lVar3 + 0x1ac));
    return iVar1;
  }
  return 0;
}

Assistant:

static int gost_grasshopper_set_asn1_parameters(EVP_CIPHER_CTX *ctx, ASN1_TYPE *params)
{
    if (EVP_CIPHER_CTX_mode(ctx) == EVP_CIPH_CTR_MODE) {
        gost_grasshopper_cipher_ctx_ctr *ctr = EVP_CIPHER_CTX_get_cipher_data(ctx);

        /* CMS implies 256kb section_size */
        ctr->section_size = 256*1024;

        return gost2015_set_asn1_params(params,
               EVP_CIPHER_CTX_original_iv(ctx), 8, ctr->kdf_seed);
    }
    return 0;
}